

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_18::BetweenCardinalityImpl::DescribeTo
          (BetweenCardinalityImpl *this,ostream *os)

{
  ostream *poVar1;
  int n;
  int n_00;
  int n_01;
  string local_88;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  BetweenCardinalityImpl *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  if (this->min_ == 0) {
    if (this->max_ == 0) {
      std::operator<<(os,"never called");
    }
    else if (this->max_ == 0x7fffffff) {
      std::operator<<(os,"called any number of times");
    }
    else {
      poVar1 = std::operator<<(os,"called at most ");
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_38,(_anonymous_namespace_ *)(ulong)(uint)this->max_,n);
      std::operator<<(poVar1,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else if (this->min_ == this->max_) {
    poVar1 = std::operator<<(os,"called ");
    (anonymous_namespace)::FormatTimes_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)(ulong)(uint)this->min_,n_00);
    std::operator<<(poVar1,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else if (this->max_ == 0x7fffffff) {
    poVar1 = std::operator<<(os,"called at least ");
    (anonymous_namespace)::FormatTimes_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)(ulong)(uint)this->min_,n_01);
    std::operator<<(poVar1,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    poVar1 = std::operator<<(os,"called between ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->min_);
    poVar1 = std::operator<<(poVar1," and ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->max_);
    std::operator<<(poVar1," times");
  }
  return;
}

Assistant:

void BetweenCardinalityImpl::DescribeTo(::std::ostream* os) const {
  if (min_ == 0) {
    if (max_ == 0) {
      *os << "never called";
    } else if (max_ == INT_MAX) {
      *os << "called any number of times";
    } else {
      *os << "called at most " << FormatTimes(max_);
    }
  } else if (min_ == max_) {
    *os << "called " << FormatTimes(min_);
  } else if (max_ == INT_MAX) {
    *os << "called at least " << FormatTimes(min_);
  } else {
    // 0 < min_ < max_ < INT_MAX
    *os << "called between " << min_ << " and " << max_ << " times";
  }
}